

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

void TestConstExpr::ComparisonTestTU<short,unsigned_long>(void)

{
  int iVar1;
  
  if (ComparisonTestTU<short,unsigned_long>()::b1 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<short,unsigned_long>()::b1);
    if (iVar1 != 0) {
      ComparisonTestTU<short,_unsigned_long>::b1 = LessThanTest<short,unsigned_long>();
      __cxa_guard_release(&ComparisonTestTU<short,unsigned_long>()::b1);
    }
  }
  if (ComparisonTestTU<short,unsigned_long>()::b2 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<short,unsigned_long>()::b2);
    if (iVar1 != 0) {
      ComparisonTestTU<short,_unsigned_long>::b2 = LessThanEqualTest<short,unsigned_long>();
      __cxa_guard_release(&ComparisonTestTU<short,unsigned_long>()::b2);
    }
  }
  if (ComparisonTestTU<short,unsigned_long>()::b3 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<short,unsigned_long>()::b3);
    if (iVar1 != 0) {
      ComparisonTestTU<short,_unsigned_long>::b3 = GreaterThanTest<short,unsigned_long>();
      __cxa_guard_release(&ComparisonTestTU<short,unsigned_long>()::b3);
    }
  }
  if (ComparisonTestTU<short,unsigned_long>()::b4 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<short,unsigned_long>()::b4);
    if (iVar1 != 0) {
      ComparisonTestTU<short,_unsigned_long>::b4 = GreaterThanEqualTest<short,unsigned_long>();
      __cxa_guard_release(&ComparisonTestTU<short,unsigned_long>()::b4);
    }
  }
  if (ComparisonTestTU<short,unsigned_long>()::b5 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<short,unsigned_long>()::b5);
    if (iVar1 != 0) {
      ComparisonTestTU<short,_unsigned_long>::b5 = EqualTest<short,unsigned_long>();
      __cxa_guard_release(&ComparisonTestTU<short,unsigned_long>()::b5);
    }
  }
  if (ComparisonTestTU<short,unsigned_long>()::b6 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<short,unsigned_long>()::b6);
    if (iVar1 != 0) {
      ComparisonTestTU<short,_unsigned_long>::b6 = NotEqualTest<short,unsigned_long>();
      __cxa_guard_release(&ComparisonTestTU<short,unsigned_long>()::b6);
    }
  }
  return;
}

Assistant:

void ComparisonTestTU()
	{
		static bool b1 = LessThanTest<T, U>();
		static bool b2 = LessThanEqualTest<T, U>();
		static bool b3 = GreaterThanTest<T, U>();
		static bool b4 = GreaterThanEqualTest<T, U>();
		static bool b5 = EqualTest<T, U>();
		static bool b6 = NotEqualTest<T, U>();
	}